

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

void __thiscall
cmCTest::HandleScriptArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *SRArgumentSpecified)

{
  pointer pbVar1;
  pointer pcVar2;
  ulong uVar3;
  int iVar4;
  cmCTestScriptHandler *pcVar5;
  string arg;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[*i]._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + pbVar1[*i]._M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)local_50);
  if (iVar4 == 0) {
LAB_002922b4:
    uVar3 = *i;
    if (uVar3 < ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      this->RunConfigurationScript = true;
      *i = uVar3 + 1;
      pcVar5 = (cmCTestScriptHandler *)GetHandler(this,"script");
      if (*SRArgumentSpecified == false) {
        cmCTestScriptHandler::AddConfigurationScript
                  (pcVar5,(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p,false);
      }
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)local_50);
    if (iVar4 == 0) goto LAB_002922b4;
  }
  iVar4 = std::__cxx11::string::compare((char *)local_50);
  if (iVar4 == 0) {
LAB_0029232d:
    uVar3 = *i;
    if (uVar3 < ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      *SRArgumentSpecified = true;
      this->RunConfigurationScript = true;
      *i = uVar3 + 1;
      pcVar5 = (cmCTestScriptHandler *)GetHandler(this,"script");
      cmCTestScriptHandler::AddConfigurationScript
                (pcVar5,(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p,true);
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)local_50);
    if (iVar4 == 0) goto LAB_0029232d;
  }
  iVar4 = std::__cxx11::string::compare((char *)local_50);
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)local_50);
    if (iVar4 != 0) goto LAB_002923f9;
  }
  uVar3 = *i;
  if (uVar3 < ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    this->RunConfigurationScript = true;
    *i = uVar3 + 1;
    pcVar5 = (cmCTestScriptHandler *)GetHandler(this,"script");
    if (*SRArgumentSpecified == false) {
      cmCTestScriptHandler::AddConfigurationScript
                (pcVar5,(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p,true);
    }
  }
LAB_002923f9:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void cmCTest::HandleScriptArguments(size_t& i, std::vector<std::string>& args,
                                    bool& SRArgumentSpecified)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-SP", "--script-new-process") &&
      i < args.size() - 1) {
    this->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch =
      static_cast<cmCTestScriptHandler*>(this->GetHandler("script"));
    // -SR is an internal argument, -SP should be ignored when it is passed
    if (!SRArgumentSpecified) {
      ch->AddConfigurationScript(args[i].c_str(), false);
    }
  }

  if (this->CheckArgument(arg, "-SR", "--script-run") && i < args.size() - 1) {
    SRArgumentSpecified = true;
    this->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch =
      static_cast<cmCTestScriptHandler*>(this->GetHandler("script"));
    ch->AddConfigurationScript(args[i].c_str(), true);
  }

  if (this->CheckArgument(arg, "-S", "--script") && i < args.size() - 1) {
    this->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch =
      static_cast<cmCTestScriptHandler*>(this->GetHandler("script"));
    // -SR is an internal argument, -S should be ignored when it is passed
    if (!SRArgumentSpecified) {
      ch->AddConfigurationScript(args[i].c_str(), true);
    }
  }
}